

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t nblimbs;
  long lVar8;
  bool bVar9;
  
  bVar9 = X == B;
  if (bVar9) {
    B = A;
  }
  if ((A == X || bVar9) || (iVar2 = mbedtls_mpi_copy(X,A), iVar2 == 0)) {
    X->s = 1;
    nblimbs = B->n;
    if (nblimbs != 0) {
      do {
        if (B->p[nblimbs - 1] != 0) goto LAB_001259a2;
        nblimbs = nblimbs - 1;
      } while (nblimbs != 0);
      nblimbs = 0;
    }
LAB_001259a2:
    iVar2 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar2 == 0) {
      puVar4 = X->p;
      iVar2 = 0;
      if (nblimbs == 0) {
        uVar6 = 0;
        uVar7 = 0;
      }
      else {
        pmVar1 = B->p;
        uVar6 = 0;
        sVar5 = 0;
        do {
          uVar7 = uVar6 + *puVar4;
          uVar6 = (ulong)CARRY8(uVar7,pmVar1[sVar5]) + (ulong)CARRY8(uVar6,*puVar4);
          *puVar4 = uVar7 + pmVar1[sVar5];
          sVar5 = sVar5 + 1;
          puVar4 = puVar4 + 1;
          uVar7 = nblimbs;
        } while (nblimbs != sVar5);
      }
      if (uVar6 != 0) {
        lVar8 = nblimbs << 3;
        do {
          if (X->n <= uVar7) {
            iVar3 = mbedtls_mpi_grow(X,uVar7 + 1);
            if (iVar3 != 0) {
              return iVar3;
            }
            puVar4 = (ulong *)((long)X->p + lVar8);
          }
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 8;
          bVar9 = CARRY8(*puVar4,uVar6);
          *puVar4 = *puVar4 + uVar6;
          puVar4 = puVar4 + 1;
          uVar6 = (ulong)bVar9;
        } while (bVar9);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c, tmp;

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    /*
     * tmp is used because it might happen that p == o
     */
    for( i = 0; i < j; i++, o++, p++ )
    {
        tmp= *o;
        *p +=  c; c  = ( *p <  c );
        *p += tmp; c += ( *p < tmp );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}